

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_make_ryuma_mayor_saveable.hpp
# Opt level: O0

void __thiscall PatchMakeRyumaMayorSaveable::alter_rom(PatchMakeRyumaMayorSaveable *this,ROM *rom)

{
  ROM *pRVar1;
  uint16_t uVar2;
  uint32_t longWord;
  Code *pCVar3;
  Code local_128;
  Code local_98;
  ROM *local_18;
  ROM *rom_local;
  PatchMakeRyumaMayorSaveable *this_local;
  
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._labels._M_t._M_impl._0_8_ = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._pending_branches._M_t._M_impl._0_8_ = 0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_18 = rom;
  rom_local = (ROM *)this;
  md::Code::Code(&local_98);
  pCVar3 = md::Code::rts(&local_98);
  md::ROM::set_code(rom,0x136be,pCVar3);
  md::Code::~Code(&local_98);
  pRVar1 = local_18;
  longWord = md::ROM::get_long(local_18,0x28364);
  md::ROM::set_long(pRVar1,0x28362,longWord);
  pRVar1 = local_18;
  uVar2 = md::ROM::get_word(local_18,0x2546a);
  md::ROM::set_word(pRVar1,0x2546a,uVar2 - 2);
  md::ROM::set_word(local_18,0x28366,0x1421);
  md::ROM::set_word(local_18,0x2546c,0x2f39);
  md::ROM::set_word(local_18,0x9ba62,0xfefe);
  md::ROM::set_byte(local_18,0x2837e,'\0');
  md::ROM::set_word(local_18,0x28380,0x17e8);
  md::ROM::set_word(local_18,0x2648e,0xf908);
  md::ROM::set_word(local_18,0x26490,0x23);
  md::ROM::set_word(local_18,0x26492,0x1801);
  md::ROM::set_word(local_18,0x26494,0x17ff);
  pRVar1 = local_18;
  local_128._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_128._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_128._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_128._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128._labels._M_t._M_impl._0_8_ = 0;
  local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_128._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128._pending_branches._M_t._M_impl._0_8_ = 0;
  local_128._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  md::Code::Code(&local_128);
  pCVar3 = md::Code::rts(&local_128);
  md::ROM::set_code(pRVar1,0x26496,pCVar3);
  md::Code::~Code(&local_128);
  md::ROM::set_long(local_18,0x26498,0xffffffff);
  return;
}

Assistant:

void alter_rom(md::ROM& rom) override
    {
        // Disable the cutscene (CSA_0068) when opening vanilla lithograph chest
        rom.set_code(0x136BE, md::Code().rts());

        // Shifts the boss cutscene right before to make room for one more instruction in mayor cutscene
        rom.set_long(0x28362, rom.get_long(0x28364));
        rom.set_word(0x2546A, rom.get_word(0x2546A) - 2);

        // Set the bit 1 of flag 1004 as the first instruction in mayor's cutscene, and move starting
        // offset of this cutscene accordingly
        rom.set_word(0x28366, 0x1421);
        rom.set_word(0x2546C, 0x2F39);

        // Edit Friday blocker behavior in the treasure room
        rom.set_word(0x9BA62, 0xFEFE);

        // Change the second mayor reward from "fixed 100 golds" to "item with ID located at 0x2837F"
        rom.set_byte(0x2837E, 0x00);
        rom.set_word(0x28380, 0x17E8);

        // Remove the "I think we need an exorcism" dialogue for the mayor when progression flags are much further in the game
        rom.set_word(0x2648E, 0xF908); // CheckFlagAndDisplayMessage
        rom.set_word(0x26490, 0x0023); // on bit 3 of flag FF1004
        rom.set_word(0x26492, 0x1801); // Script ID for post-reward dialogue
        rom.set_word(0x26494, 0x17FF); // Script ID for reward cutscene
        rom.set_code(0x26496, md::Code().rts());
        // Clear out the rest
        rom.set_long(0x26498, 0xFFFFFFFF);
    }